

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O3

void __thiscall
GslSpan_AsWriteableBytes_Test::~GslSpan_AsWriteableBytes_Test(GslSpan_AsWriteableBytes_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (GslSpan, AsWriteableBytes) {
    int a[] = {1, 2, 3, 4};

    {
#ifdef CONFIRM_COMPILATION_ERRORS
        // you should not be able to get writeable bytes for const objects
        span<const int> s = a;
        EXPECT_EQ (s.length (), 4);
        span<const byte> bs = as_writeable_bytes (s);
        EXPECT_EQ (static_cast<void *> (bs.data ()), static_cast<void *> (s.data ()));
        EXPECT_EQ (bs.length (), s.length_bytes ());
#endif
    }

    {
        span<int> s;
        auto bs = as_writeable_bytes (s);
        EXPECT_EQ (bs.length (), s.length ());
        EXPECT_EQ (bs.length (), 0);
        EXPECT_EQ (bs.size_bytes (), 0);
        EXPECT_EQ (static_cast<void *> (bs.data ()), static_cast<void *> (s.data ()));
        EXPECT_EQ (bs.data (), nullptr);
    }

    {
        span<int> s = make_span (a);
        auto bs = as_writeable_bytes (s);
        EXPECT_EQ (static_cast<void *> (bs.data ()), static_cast<void *> (s.data ()));
        EXPECT_EQ (bs.length (), s.length_bytes ());
    }
}